

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)36>,_std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)36>_>_>
 __thiscall
wabt::MakeUnique<wabt::RefTypeExpr<(wabt::ExprType)36>,wabt::Type&,wabt::Location&>
          (wabt *this,Type *args,Location *args_1)

{
  Enum EVar1;
  char *pcVar2;
  size_type sVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  
  puVar5 = (undefined8 *)operator_new(0x40);
  EVar1 = args->enum_;
  puVar5[1] = 0;
  puVar5[2] = 0;
  pcVar2 = (args_1->filename).data_;
  sVar3 = (args_1->filename).size_;
  uVar4 = *(undefined8 *)((long)&args_1->field_1 + 8);
  puVar5[5] = (args_1->field_1).field_1.offset;
  puVar5[6] = uVar4;
  puVar5[3] = pcVar2;
  puVar5[4] = sVar3;
  *(undefined4 *)(puVar5 + 7) = 0x24;
  *puVar5 = &PTR__Expr_001c4e20;
  *(Enum *)((long)puVar5 + 0x3c) = EVar1;
  *(undefined8 **)this = puVar5;
  return (__uniq_ptr_data<wabt::RefTypeExpr<(wabt::ExprType)36>,_std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)36>_>,_true,_true>
          )(__uniq_ptr_data<wabt::RefTypeExpr<(wabt::ExprType)36>,_std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)36>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}